

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiID IVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  ImGuiTabItem *pIVar7;
  float fVar8;
  float fVar9;
  ImGuiTabItemFlags IVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ImGuiTabItem *pIVar18;
  ulong uVar19;
  ImGuiTabItem *unaff_R14;
  ImGuiTabItem *pIVar20;
  bool bVar21;
  ImGuiTabItem item_tmp;
  undefined1 uStack_29;
  
  IVar1 = tab_bar->ReorderRequestTabId;
  if (IVar1 != 0) {
    uVar16 = (ulong)(tab_bar->Tabs).Size;
    bVar21 = 0 < (long)uVar16;
    if (0 < (long)uVar16) {
      unaff_R14 = (tab_bar->Tabs).Data;
      bVar21 = true;
      if (unaff_R14->ID != IVar1) {
        pIVar18 = unaff_R14 + (uVar16 - 1);
        uVar12 = 1;
        pIVar20 = unaff_R14;
        do {
          uVar19 = uVar12;
          unaff_R14 = pIVar18;
          if (uVar16 == uVar19) break;
          unaff_R14 = pIVar20 + 1;
          pIVar7 = pIVar20 + 1;
          uVar12 = uVar19 + 1;
          pIVar20 = unaff_R14;
        } while (pIVar7->ID != IVar1);
        bVar21 = uVar19 < uVar16;
      }
    }
    if (bVar21) goto LAB_002400ab;
  }
  unaff_R14 = (ImGuiTabItem *)0x0;
LAB_002400ab:
  if ((unaff_R14 != (ImGuiTabItem *)0x0) && ((unaff_R14->Flags & 0x20) == 0)) {
    iVar13 = ImGuiTabBar::GetTabOrder(tab_bar,unaff_R14);
    iVar17 = (int)tab_bar->ReorderRequestOffset;
    uVar14 = iVar13 + iVar17;
    if ((-1 < (int)uVar14) && ((int)uVar14 < (tab_bar->Tabs).Size)) {
      pIVar20 = (tab_bar->Tabs).Data;
      uVar2 = pIVar20[uVar14].Flags;
      if (((uVar2 & 0x20) == 0) && (((uVar2 ^ unaff_R14->Flags) & 0xc0) == 0)) {
        pIVar20 = pIVar20 + uVar14;
        uVar3._0_2_ = unaff_R14->IndexDuringLayout;
        uVar3._2_1_ = unaff_R14->WantClose;
        uVar3._3_1_ = unaff_R14->field_0x23;
        IVar1 = unaff_R14->ID;
        IVar10 = unaff_R14->Flags;
        iVar13 = unaff_R14->LastFrameVisible;
        iVar11 = unaff_R14->LastFrameSelected;
        fVar8 = unaff_R14->Offset;
        fVar9 = unaff_R14->Width;
        uVar4 = unaff_R14->ContentWidth;
        uVar5 = unaff_R14->NameOffset;
        uVar6 = unaff_R14->BeginOrder;
        uStack_29 = (undefined1)((ushort)uVar6 >> 8);
        pIVar18 = pIVar20 + 1;
        pIVar7 = pIVar20;
        if (0 < tab_bar->ReorderRequestOffset) {
          pIVar18 = unaff_R14;
          pIVar7 = unaff_R14 + 1;
        }
        iVar15 = -iVar17;
        if (0 < iVar17) {
          iVar15 = iVar17;
        }
        memmove(pIVar18,pIVar7,(ulong)(uint)(iVar15 << 2) * 9);
        *(uint *)((long)&pIVar20->BeginOrder + 1) = CONCAT31((int3)uVar3,uStack_29);
        pIVar20->Offset = fVar8;
        pIVar20->Width = fVar9;
        pIVar20->ContentWidth = (float)uVar4;
        pIVar20->NameOffset = uVar5;
        pIVar20->BeginOrder = uVar6;
        pIVar20->ID = IVar1;
        pIVar20->Flags = IVar10;
        pIVar20->LastFrameVisible = iVar13;
        pIVar20->LastFrameSelected = iVar11;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}